

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test9::iterate(GPUShaderFP64Test9 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  undefined1 local_d0 [8];
  _test_case test_case;
  _variable_type *variable_type;
  _operation_type operation_type;
  uint n_operation_type;
  uint n_variable_type;
  uint n_variable_types;
  _variable_type variable_types [13];
  allocator<char> local_31;
  string local_30;
  GPUShaderFP64Test9 *local_10;
  GPUShaderFP64Test9 *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_gpu_shader_fp64 is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  memcpy(&n_variable_type,&DAT_029fd550,0x34);
  for (operation_type = OPERATION_TYPE_ADDITION;
      operation_type < (OPERATION_TYPE_COUNT|OPERATION_TYPE_PRE_INCREMENTATION);
      operation_type = operation_type + OPERATION_TYPE_DIVISION) {
    for (variable_type._4_4_ = OPERATION_TYPE_ADDITION; variable_type._4_4_ < OPERATION_TYPE_COUNT;
        variable_type._4_4_ = variable_type._4_4_ + OPERATION_TYPE_DIVISION) {
      test_case._40_8_ = &n_variable_type + operation_type;
      _test_case::_test_case((_test_case *)local_d0);
      local_d0._0_4_ = variable_type._4_4_;
      local_d0._4_4_ = *(undefined4 *)test_case._40_8_;
      test_case.vs_body.field_2._8_4_ = *(undefined4 *)test_case._40_8_;
      initTestIteration(this,(_test_case *)local_d0);
      bVar1 = executeTestIteration(this,(_test_case *)local_d0);
      this->m_has_test_passed = (this->m_has_test_passed & 1U & bVar1) != 0;
      _test_case::~_test_case((_test_case *)local_d0);
    }
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test9::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	/* Initialize all ES objects required to run all the checks */
	initTest();

	/* Iterate through all variable types we want to test */
	const Utils::_variable_type variable_types[] = { Utils::VARIABLE_TYPE_DMAT2,   Utils::VARIABLE_TYPE_DMAT2X3,
													 Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3,
													 Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
													 Utils::VARIABLE_TYPE_DMAT4,   Utils::VARIABLE_TYPE_DMAT4X2,
													 Utils::VARIABLE_TYPE_DMAT4X3, Utils::VARIABLE_TYPE_DOUBLE,
													 Utils::VARIABLE_TYPE_DVEC2,   Utils::VARIABLE_TYPE_DVEC3,
													 Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_variable_types = sizeof(variable_types) / sizeof(variable_types[0]);

	for (unsigned int n_variable_type = 0; n_variable_type < n_variable_types; ++n_variable_type)
	{
		/* Iterate through all operation types we want to check */
		for (unsigned int n_operation_type = 0; n_operation_type < OPERATION_TYPE_COUNT; ++n_operation_type)
		{
			_operation_type				 operation_type = (_operation_type)n_operation_type;
			const Utils::_variable_type& variable_type  = variable_types[n_variable_type];

			/* Construct test case descriptor */
			_test_case test_case;

			test_case.operation_type	   = operation_type;
			test_case.result_variable_type = variable_type;
			test_case.variable_type		   = variable_type;

			/* Run the iteration */
			initTestIteration(test_case);

			m_has_test_passed &= executeTestIteration(test_case);
		} /* for (all operation types) */
	}	 /* for (all variable types) */

	/* All done. */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}